

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_schema.cpp
# Opt level: O3

void __thiscall duckdb::CSVSchema::MergeSchemas(CSVSchema *this,CSVSchema *other,bool null_padding)

{
  LogicalTypeId source;
  LogicalTypeId destination;
  LogicalTypeId destination_00;
  pointer pcVar1;
  LogicalTypeId *pLVar2;
  bool bVar3;
  ulong uVar4;
  reference pvVar5;
  reference pvVar6;
  mapped_type *pmVar7;
  ulong uVar8;
  long lVar9;
  size_type __n;
  LogicalTypeId *pLVar10;
  shared_ptr<duckdb::ExtraTypeInfo,_true> *other_00;
  size_type __n_00;
  initializer_list<duckdb::LogicalType> __l;
  vector<duckdb::LogicalType,_true> candidates_by_specificity;
  string name;
  LogicalType type;
  LogicalTypeId *local_e0;
  LogicalTypeId *local_d8;
  string local_c8;
  undefined1 local_a8 [32];
  undefined1 local_88 [40];
  LogicalType local_60;
  LogicalType local_48;
  
  LogicalType::LogicalType((LogicalType *)local_a8,BOOLEAN);
  LogicalType::LogicalType((LogicalType *)(local_a8 + 0x18),BIGINT);
  LogicalType::LogicalType((LogicalType *)(local_88 + 0x10),DOUBLE);
  LogicalType::LogicalType(&local_60,VARCHAR);
  __l._M_len = 4;
  __l._M_array = (iterator)local_a8;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_e0,__l,
             (allocator_type *)&local_c8);
  lVar9 = 0x48;
  do {
    LogicalType::~LogicalType((LogicalType *)(local_a8 + lVar9));
    lVar9 = lVar9 + -0x18;
  } while (lVar9 != -0x18);
  uVar4 = (long)(this->columns).
                super_vector<duckdb::CSVColumnInfo,_std::allocator<duckdb::CSVColumnInfo>_>.
                super__Vector_base<duckdb::CSVColumnInfo,_std::allocator<duckdb::CSVColumnInfo>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(this->columns).
                super_vector<duckdb::CSVColumnInfo,_std::allocator<duckdb::CSVColumnInfo>_>.
                super__Vector_base<duckdb::CSVColumnInfo,_std::allocator<duckdb::CSVColumnInfo>_>.
                _M_impl.super__Vector_impl_data._M_start;
  if (uVar4 == 0) {
    uVar4 = 0;
    __n = 0;
  }
  else if ((other->columns).
           super_vector<duckdb::CSVColumnInfo,_std::allocator<duckdb::CSVColumnInfo>_>.
           super__Vector_base<duckdb::CSVColumnInfo,_std::allocator<duckdb::CSVColumnInfo>_>._M_impl
           .super__Vector_impl_data._M_finish ==
           (other->columns).
           super_vector<duckdb::CSVColumnInfo,_std::allocator<duckdb::CSVColumnInfo>_>.
           super__Vector_base<duckdb::CSVColumnInfo,_std::allocator<duckdb::CSVColumnInfo>_>._M_impl
           .super__Vector_impl_data._M_start) {
    __n = ((long)uVar4 >> 3) * 0x6db6db6db6db6db7;
  }
  else {
    __n_00 = 0;
    do {
      pvVar5 = vector<duckdb::CSVColumnInfo,_true>::operator[](&this->columns,__n_00);
      source = (pvVar5->type).id_;
      pvVar5 = vector<duckdb::CSVColumnInfo,_true>::operator[](&other->columns,__n_00);
      destination = (pvVar5->type).id_;
      pvVar5 = vector<duckdb::CSVColumnInfo,_true>::operator[](&this->columns,__n_00);
      pvVar6 = vector<duckdb::CSVColumnInfo,_true>::operator[](&other->columns,__n_00);
      bVar3 = LogicalType::operator==(&pvVar5->type,&pvVar6->type);
      if (!bVar3) {
        bVar3 = CanWeCastIt(source,destination);
        if (bVar3) {
          pvVar6 = vector<duckdb::CSVColumnInfo,_true>::operator[](&other->columns,__n_00);
          pvVar5 = vector<duckdb::CSVColumnInfo,_true>::operator[](&this->columns,__n_00);
          if (pvVar5 != pvVar6) {
            (pvVar5->type).id_ = (pvVar6->type).id_;
            (pvVar5->type).physical_type_ = (pvVar6->type).physical_type_;
            other_00 = &(pvVar6->type).type_info_;
LAB_014e764d:
            shared_ptr<duckdb::ExtraTypeInfo,_true>::operator=(&(pvVar5->type).type_info_,other_00);
          }
        }
        else {
          bVar3 = CanWeCastIt(destination,source);
          pLVar2 = local_d8;
          pLVar10 = local_e0;
          if (!bVar3) {
            for (; pLVar10 != pLVar2; pLVar10 = pLVar10 + 0x18) {
              destination_00 = *pLVar10;
              bVar3 = CanWeCastIt(source,destination_00);
              if ((bVar3) && (bVar3 = CanWeCastIt(destination,destination_00), bVar3)) {
                pvVar5 = vector<duckdb::CSVColumnInfo,_true>::operator[](&this->columns,__n_00);
                if ((LogicalType *)pLVar10 != &pvVar5->type) {
                  (pvVar5->type).id_ = *pLVar10;
                  (pvVar5->type).physical_type_ = pLVar10[1];
                  other_00 = (shared_ptr<duckdb::ExtraTypeInfo,_true> *)(pLVar10 + 8);
                  goto LAB_014e764d;
                }
                break;
              }
            }
          }
        }
      }
      __n_00 = __n_00 + 1;
      uVar4 = (long)(this->columns).
                    super_vector<duckdb::CSVColumnInfo,_std::allocator<duckdb::CSVColumnInfo>_>.
                    super__Vector_base<duckdb::CSVColumnInfo,_std::allocator<duckdb::CSVColumnInfo>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->columns).
                    super_vector<duckdb::CSVColumnInfo,_std::allocator<duckdb::CSVColumnInfo>_>.
                    super__Vector_base<duckdb::CSVColumnInfo,_std::allocator<duckdb::CSVColumnInfo>_>
                    ._M_impl.super__Vector_impl_data._M_start;
      __n = ((long)uVar4 >> 3) * 0x6db6db6db6db6db7;
    } while ((__n_00 < __n) &&
            (__n_00 < (ulong)(((long)(other->columns).
                                     super_vector<duckdb::CSVColumnInfo,_std::allocator<duckdb::CSVColumnInfo>_>
                                     .
                                     super__Vector_base<duckdb::CSVColumnInfo,_std::allocator<duckdb::CSVColumnInfo>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(other->columns).
                                     super_vector<duckdb::CSVColumnInfo,_std::allocator<duckdb::CSVColumnInfo>_>
                                     .
                                     super__Vector_base<duckdb::CSVColumnInfo,_std::allocator<duckdb::CSVColumnInfo>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 3) *
                             0x6db6db6db6db6db7)));
  }
  if ((null_padding) &&
     ((uVar8 = (long)(other->columns).
                     super_vector<duckdb::CSVColumnInfo,_std::allocator<duckdb::CSVColumnInfo>_>.
                     super__Vector_base<duckdb::CSVColumnInfo,_std::allocator<duckdb::CSVColumnInfo>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(other->columns).
                     super_vector<duckdb::CSVColumnInfo,_std::allocator<duckdb::CSVColumnInfo>_>.
                     super__Vector_base<duckdb::CSVColumnInfo,_std::allocator<duckdb::CSVColumnInfo>_>
                     ._M_impl.super__Vector_impl_data._M_start, uVar4 < uVar8 &&
      (__n < (ulong)(((long)uVar8 >> 3) * 0x6db6db6db6db6db7))))) {
    do {
      pvVar5 = vector<duckdb::CSVColumnInfo,_true>::operator[](&other->columns,__n);
      pcVar1 = (pvVar5->name)._M_dataplus._M_p;
      local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_c8,pcVar1,pcVar1 + (pvVar5->name)._M_string_length);
      pvVar5 = vector<duckdb::CSVColumnInfo,_true>::operator[](&other->columns,__n);
      LogicalType::LogicalType(&local_48,&pvVar5->type);
      CSVColumnInfo::CSVColumnInfo((CSVColumnInfo *)local_a8,&local_c8,&local_48);
      ::std::vector<duckdb::CSVColumnInfo,_std::allocator<duckdb::CSVColumnInfo>_>::
      emplace_back<duckdb::CSVColumnInfo>
                ((vector<duckdb::CSVColumnInfo,_std::allocator<duckdb::CSVColumnInfo>_> *)this,
                 (CSVColumnInfo *)local_a8);
      LogicalType::~LogicalType((LogicalType *)local_88);
      if ((undefined1 *)local_a8._0_8_ != local_a8 + 0x10) {
        operator_delete((void *)local_a8._0_8_);
      }
      pmVar7 = ::std::__detail::
               _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)&this->name_idx_map,&local_c8);
      *pmVar7 = __n;
      LogicalType::~LogicalType(&local_48);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
        operator_delete(local_c8._M_dataplus._M_p);
      }
      __n = __n + 1;
    } while (__n < (ulong)(((long)(other->columns).
                                  super_vector<duckdb::CSVColumnInfo,_std::allocator<duckdb::CSVColumnInfo>_>
                                  .
                                  super__Vector_base<duckdb::CSVColumnInfo,_std::allocator<duckdb::CSVColumnInfo>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(other->columns).
                                  super_vector<duckdb::CSVColumnInfo,_std::allocator<duckdb::CSVColumnInfo>_>
                                  .
                                  super__Vector_base<duckdb::CSVColumnInfo,_std::allocator<duckdb::CSVColumnInfo>_>
                                  ._M_impl.super__Vector_impl_data._M_start >> 3) *
                          0x6db6db6db6db6db7));
  }
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_e0);
  return;
}

Assistant:

void CSVSchema::MergeSchemas(CSVSchema &other, bool null_padding) {
	// TODO: We could also merge names, maybe by giving preference to non-generated names?
	const vector<LogicalType> candidates_by_specificity = {LogicalType::BOOLEAN, LogicalType::BIGINT,
	                                                       LogicalType::DOUBLE, LogicalType::VARCHAR};
	for (idx_t i = 0; i < columns.size() && i < other.columns.size(); i++) {
		auto this_type = columns[i].type.id();
		auto other_type = other.columns[i].type.id();
		if (columns[i].type != other.columns[i].type) {
			if (CanWeCastIt(this_type, other_type)) {
				// If we can cast this to other, this becomes other
				columns[i].type = other.columns[i].type;
			} else if (!CanWeCastIt(other_type, this_type)) {
				// If we can't cast this to other or other to this, we see which parent they can be both cast to
				for (const auto &type : candidates_by_specificity) {
					if (CanWeCastIt(this_type, type.id()) && CanWeCastIt(other_type, type.id())) {
						columns[i].type = type;
						break;
					}
				}
			}
		}
	}

	if (null_padding && other.columns.size() > columns.size()) {
		for (idx_t i = columns.size(); i < other.columns.size(); i++) {
			auto name = other.columns[i].name;
			auto type = other.columns[i].type;
			columns.push_back({name, type});
			name_idx_map[name] = i;
		}
	}
}